

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolledFile.cpp
# Opt level: O2

void __thiscall PolledFile::~PolledFile(PolledFile *this)

{
  std::unique_ptr<PolledFile::Impl,_std::default_delete<PolledFile::Impl>_>::~unique_ptr
            (&this->impl_);
  return;
}

Assistant:

PolledFile::~PolledFile() {}